

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O2

void __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::one_thread::impl::actual_disp_iface_t,_so_5::disp::one_thread::disp_params_t>
::proxy_dispatcher_template_t
          (proxy_dispatcher_template_t<so_5::disp::one_thread::impl::actual_disp_iface_t,_so_5::disp::one_thread::disp_params_t>
           *this,disp_params_t *disp_params)

{
  one_thread::impl::actual_disp_iface_t::actual_disp_iface_t(&this->super_actual_disp_iface_t);
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
       (_func_int **)&PTR__proxy_dispatcher_template_t_002c9b40;
  (this->m_disp)._M_t.
  super___uniq_ptr_impl<so_5::disp::one_thread::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::one_thread::impl::actual_disp_iface_t_*,_std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>_>
  .super__Head_base<0UL,_so_5::disp::one_thread::impl::actual_disp_iface_t_*,_false>._M_head_impl =
       (actual_disp_iface_t *)0x0;
  one_thread::disp_params_t::disp_params_t(&this->m_disp_params,disp_params);
  (this->m_data_source_base_name)._M_dataplus._M_p =
       (pointer)&(this->m_data_source_base_name).field_2;
  (this->m_data_source_base_name)._M_string_length = 0;
  (this->m_data_source_base_name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

proxy_dispatcher_template_t( DISP_PARAMS_TYPE disp_params )
			:	m_disp_params( std::move(disp_params) )
			{}